

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

Vec_Int_t * Gia_ManInsertOrder(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wec_t *vFuncs)

{
  int iVar1;
  Vec_Int_t *vNodes;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nObjs;
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  vNodes->pArray = piVar2;
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar5];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) {
        return vNodes;
      }
      Gia_ManInsertOrder_rec(p,iVar1,vObjs,vFuncs,vNodes);
      lVar5 = lVar5 + 1;
      pVVar3 = p->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManInsertOrder( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wec_t * vFuncs )
{
    int i, Id;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        Gia_ManInsertOrder_rec( p, Id, vObjs, vFuncs, vNodes );
    return vNodes;
}